

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R3_binary_search_tree.c
# Opt level: O2

NODE * insert(NODE **p,KEY key)

{
  NODE *pNVar1;
  
  while (pNVar1 = *p, pNVar1 != (NODE *)0x0) {
    if (pNVar1->data == key) {
      return (NODE *)0x0;
    }
    p = &pNVar1->left + (pNVar1->data <= key);
  }
  pNVar1 = (NODE *)malloc(0x18);
  if (pNVar1 != (NODE *)0x0) {
    pNVar1->data = key;
    pNVar1->left = (node *)0x0;
    pNVar1->right = (node *)0x0;
    *p = pNVar1;
    return pNVar1;
  }
  puts("Out of memory");
  exit(1);
}

Assistant:

NODE *insert(NODE **p, KEY key) {
  NODE *new;
  while (*p != NULL) {
    if (keyequal(key, (*p)->data)) {
      return NULL;
    } else if (keylt(key, (*p)->data)) {
      p = &(*p)->left;
    } else {
      p = &(*p)->right;
    }
  }

  if ((new = (NODE *)malloc(sizeof(NODE))) == NULL) {
    printf("Out of memory\n");
    exit(1);
  }

  new->data = key;
  new->left = NULL;
  new->right = NULL;

  *p = new;
  return new;
}